

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

void ImfFloatToHalf(float f,ImfHalf *h)

{
  uint16_t uVar1;
  half *in_RDI;
  float in_stack_ffffffffffffffec;
  
  Imath_3_2::half::half(in_RDI,in_stack_ffffffffffffffec);
  uVar1 = Imath_3_2::half::bits((half *)&stack0xffffffffffffffee);
  in_RDI->_h = uVar1;
  return;
}

Assistant:

void
ImfFloatToHalf (float f, ImfHalf* h)
{
    *h = half (f).bits ();
}